

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void av1_init_tpl_txfm_stats(TplTxfmStats *tpl_txfm_stats)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[0x403] = 0x100;
  in_RDI[0x402] = 0;
  memset(in_RDI + 2,0,(long)(int)in_RDI[0x403] << 3);
  memset(in_RDI + 0x202,0,(long)(int)in_RDI[0x403] << 3);
  return;
}

Assistant:

void av1_init_tpl_txfm_stats(TplTxfmStats *tpl_txfm_stats) {
  tpl_txfm_stats->ready = 0;
  tpl_txfm_stats->coeff_num = 256;
  tpl_txfm_stats->txfm_block_count = 0;
  memset(tpl_txfm_stats->abs_coeff_sum, 0,
         sizeof(tpl_txfm_stats->abs_coeff_sum[0]) * tpl_txfm_stats->coeff_num);
  memset(tpl_txfm_stats->abs_coeff_mean, 0,
         sizeof(tpl_txfm_stats->abs_coeff_mean[0]) * tpl_txfm_stats->coeff_num);
}